

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O3

QDataStream * __thiscall QDataStream::writeBytes(QDataStream *this,char *s,qint64 len)

{
  ssize_t sVar1;
  size_t in_RCX;
  
  if (-1 < len) {
    if (this->dev == (QIODevice *)0x0) {
      return this;
    }
    if (this->q_status != '\0') {
      return this;
    }
    if ((ulong)len >> 1 < 0x7fffffff) {
      operator<<(this,(qint32)len);
      if (len == 0) {
        return this;
      }
    }
    else if (this->ver < 0x16) {
      if (len != 0xfffffffe) {
        this->q_status = '\x04';
        return this;
      }
      operator<<(this,-2);
    }
    else {
      operator<<(this,-2);
      operator<<(this,len);
    }
    if (this->dev == (QIODevice *)0x0) {
      return this;
    }
    if (this->q_status != '\0') {
      return this;
    }
    sVar1 = QIODevice::write(this->dev,(int)s,(void *)len,in_RCX);
    if (sVar1 == len) {
      return this;
    }
  }
  this->q_status = '\x03';
  return this;
}

Assistant:

QDataStream &QDataStream::writeBytes(const char *s, qint64 len)
{
    if (len < 0) {
        q_status = WriteFailed;
        return *this;
    }
    CHECK_STREAM_WRITE_PRECOND(*this)
    // Write length then, if any, content
    if (writeQSizeType(*this, len) && len > 0)
        writeRawData(s, len);
    return *this;
}